

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int __thiscall
fmt::v5::internal::
arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::init(arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
       *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  uint uVar2;
  type tVar3;
  ulong uVar4;
  ulong uVar5;
  entry *peVar6;
  arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *paVar7;
  entry *local_90;
  uint local_4c;
  uint i_1;
  uint local_2c;
  type arg_type;
  uint i;
  bool use_values;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *args_local;
  arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *this_local;
  
  paVar7 = this;
  if (this->map_ == (entry *)0x0) {
    uVar2 = basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            ::max_size((basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                        *)ctx);
    uVar4 = CONCAT44(0,uVar2);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar4;
    uVar5 = SUB168(auVar1 * ZEXT816(0x30),0);
    if (SUB168(auVar1 * ZEXT816(0x30),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    peVar6 = (entry *)operator_new__(uVar5);
    if (uVar4 != 0) {
      local_90 = peVar6;
      do {
        entry::entry(local_90);
        local_90 = local_90 + 1;
      } while (local_90 != peVar6 + uVar4);
    }
    this->map_ = peVar6;
    tVar3 = basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            ::type((basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                    *)ctx,0xe);
    if (tVar3 == none_type) {
      local_2c = 0;
      while( true ) {
        tVar3 = basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                ::type((basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                        *)ctx,local_2c);
        paVar7 = (arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  *)(ulong)tVar3;
        if (tVar3 == none_type) break;
        if (tVar3 == named_arg_type) {
          push_back(this,(value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                          )((anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
                             *)(*(long *)(ctx + 8) + (ulong)local_2c * 0x10))->string);
        }
        local_2c = local_2c + 1;
      }
    }
    else {
      local_4c = 0;
      while( true ) {
        uVar2 = *(uint *)(*(long *)(ctx + 8) + 0x10 + (ulong)local_4c * 0x20);
        paVar7 = (arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  *)(ulong)uVar2;
        if (uVar2 == 0) break;
        if (uVar2 == 1) {
          push_back(this,(value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                          )((anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
                             *)(*(long *)(ctx + 8) + (ulong)local_4c * 0x20))->string);
        }
        local_4c = local_4c + 1;
      }
    }
  }
  return (int)paVar7;
}

Assistant:

void arg_map<Context>::init(const basic_format_args<Context> &args) {
  if (map_)
    return;
  map_ = new entry[args.max_size()];
  bool use_values = args.type(max_packed_args - 1) == internal::none_type;
  if (use_values) {
    for (unsigned i = 0;/*nothing*/; ++i) {
      internal::type arg_type = args.type(i);
      switch (arg_type) {
        case internal::none_type:
          return;
        case internal::named_arg_type:
          push_back(args.values_[i]);
          break;
        default:
          break; // Do nothing.
      }
    }
    return;
  }
  for (unsigned i = 0; ; ++i) {
    switch (args.args_[i].type_) {
      case internal::none_type:
        return;
      case internal::named_arg_type:
        push_back(args.args_[i].value_);
        break;
      default:
        break; // Do nothing.
    }
  }
}